

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

CURLcode Curl_getformdata(SessionHandle *data,FormData **finalform,curl_httppost *post,
                         char *custom_content_type,curl_off_t *sizep)

{
  ulong uVar1;
  FormData *pFVar2;
  char *pcVar3;
  CURLcode CVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *__stream;
  size_t length;
  FormData *pFVar8;
  size_t length_00;
  curl_slist *pcVar9;
  formtype type;
  curl_httppost *file;
  curl_httppost *pcVar10;
  curl_off_t size;
  FormData *form;
  char buffer [512];
  curl_off_t local_278;
  char *local_270;
  char *local_268;
  FormData *local_260;
  FormData **local_258;
  SessionHandle *local_250;
  curl_httppost *local_248;
  long *local_240;
  undefined1 local_238 [520];
  
  CVar4 = CURLE_OK;
  local_260 = (FormData *)0x0;
  local_278 = 0;
  *finalform = (FormData *)0x0;
  if (post != (curl_httppost *)0x0) {
    local_250 = data;
    pcVar6 = formboundary(data);
    if (pcVar6 == (char *)0x0) {
      CVar4 = CURLE_OUT_OF_MEMORY;
    }
    else {
      pcVar7 = "Content-Type: multipart/form-data";
      if (custom_content_type != (char *)0x0) {
        pcVar7 = custom_content_type;
      }
      CVar4 = AddFormDataf(&local_260,(curl_off_t *)0x0,"%s; boundary=%s\r\n",pcVar7,pcVar6);
      pFVar2 = local_260;
      if (CVar4 == CURLE_OK) {
        pcVar7 = (char *)0x0;
        local_258 = finalform;
        local_240 = sizep;
        do {
          pcVar3 = pcVar7;
          if (((((local_278 != 0) &&
                (CVar4 = AddFormDataf(&local_260,&local_278,"\r\n"), CVar4 != CURLE_OK)) ||
               (CVar4 = AddFormDataf(&local_260,&local_278,"--%s\r\n",pcVar6), CVar4 != CURLE_OK))
              || ((CVar4 = AddFormDataf(&local_260,&local_278,
                                        "Content-Disposition: form-data; name=\""),
                  CVar4 != CURLE_OK ||
                  (CVar4 = AddFormData(&local_260,FORM_DATA,post->name,post->namelength,&local_278),
                  CVar4 != CURLE_OK)))) ||
             (CVar4 = AddFormDataf(&local_260,&local_278,"\""), CVar4 != CURLE_OK))
          goto joined_r0x0048e089;
          pcVar10 = post;
          local_268 = pcVar6;
          if (post->more != (curl_httppost *)0x0) {
            if (pcVar7 != (char *)0x0) {
              (*Curl_cfree)(pcVar7);
            }
            pcVar7 = formboundary(local_250);
            if (pcVar7 == (char *)0x0) {
              CVar4 = CURLE_OUT_OF_MEMORY;
              local_270 = (char *)0x0;
              pcVar3 = local_270;
              goto joined_r0x0048e089;
            }
            CVar4 = AddFormDataf(&local_260,&local_278,
                                 "\r\nContent-Type: multipart/mixed; boundary=%s\r\n",pcVar7);
            pcVar3 = pcVar7;
            if (CVar4 != CURLE_OK) goto joined_r0x0048e089;
          }
          do {
            local_270 = pcVar7;
            if (post->more == (curl_httppost *)0x0) {
              if (((post->flags & 0x51U) != 0) &&
                 ((file = post, (post->flags & 1U) != 0 || (post->showfilename != (char *)0x0))))
              goto LAB_0048de08;
            }
            else {
              CVar4 = AddFormDataf(&local_260,&local_278,
                                   "\r\n--%s\r\nContent-Disposition: attachment",local_270);
              file = pcVar10;
              pcVar3 = local_270;
              pcVar6 = local_268;
              if (CVar4 != CURLE_OK) goto joined_r0x0048e089;
LAB_0048de08:
              CVar4 = formdata_add_filename(file,&local_260,&local_278);
              pcVar3 = local_270;
              pcVar6 = local_268;
              if (CVar4 != CURLE_OK) goto joined_r0x0048e089;
            }
            if ((pcVar10->contenttype != (char *)0x0) &&
               (CVar4 = AddFormDataf(&local_260,&local_278,"\r\nContent-Type: %s"),
               pcVar3 = local_270, pcVar6 = local_268, CVar4 != CURLE_OK)) goto joined_r0x0048e089;
            for (pcVar9 = pcVar10->contentheader; pcVar9 != (curl_slist *)0x0; pcVar9 = pcVar9->next
                ) {
              CVar4 = AddFormDataf(&local_260,&local_278,"\r\n%s");
              pcVar3 = local_270;
              pcVar6 = local_268;
              if (CVar4 != CURLE_OK) goto joined_r0x0048e089;
            }
            CVar4 = AddFormDataf(&local_260,&local_278,"\r\n\r\n");
            pcVar3 = local_270;
            pcVar6 = local_268;
            if (CVar4 != CURLE_OK) goto joined_r0x0048e089;
            uVar1 = post->flags;
            if ((uVar1 & 3) == 0) {
              if ((uVar1 & 0x10) == 0) {
                length_00 = post->contentslength;
                if ((uVar1 & 0x40) != 0) {
                  pcVar6 = (char *)post->userp;
                  pFVar8 = (FormData *)(*Curl_cmalloc)(0x20);
                  if (pFVar8 != (FormData *)0x0) {
                    pFVar8->next = (FormData *)0x0;
                    pFVar8->line = pcVar6;
                    pFVar8->type = FORM_CALLBACK;
                    if (local_260 != (FormData *)0x0) {
                      local_260->next = pFVar8;
                    }
                    local_278 = local_278 + length_00;
                    CVar4 = CURLE_OK;
                    local_260 = pFVar8;
                    goto LAB_0048dfba;
                  }
                  CVar4 = CURLE_OUT_OF_MEMORY;
                  pcVar3 = local_270;
                  pcVar6 = local_268;
                  goto joined_r0x0048e089;
                }
                pcVar6 = post->contents;
                type = FORM_CONTENT;
              }
              else {
                pcVar6 = post->buffer;
                length_00 = post->bufferlength;
                type = FORM_CONTENT;
              }
LAB_0048df9e:
              CVar4 = AddFormData(&local_260,type,pcVar6,length_00,&local_278);
            }
            else {
              iVar5 = curl_strequal("-",pcVar10->contents);
              __stream = _stdin;
              if (iVar5 == 0) {
                __stream = fopen64(pcVar10->contents,"rb");
              }
              if (__stream == (FILE *)0x0) {
                if (local_250 != (SessionHandle *)0x0) {
                  Curl_failf(local_250,"couldn\'t open file \"%s\"",pcVar10->contents);
                }
                *local_258 = (FormData *)0x0;
                CVar4 = CURLE_READ_ERROR;
                pcVar3 = local_270;
                pcVar6 = local_268;
                goto joined_r0x0048e089;
              }
              if (__stream != _stdin) {
                fclose(__stream);
                pcVar6 = pcVar10->contents;
                type = FORM_FILE;
                length_00 = 0;
                goto LAB_0048df9e;
              }
              local_248 = post;
              do {
                length = fread(local_238,1,0x200,__stream);
                if (length == 0) {
                  CVar4 = CURLE_OK;
                  post = local_248;
                  break;
                }
                CVar4 = AddFormData(&local_260,FORM_CONTENT,local_238,length,&local_278);
                post = local_248;
              } while (CVar4 == CURLE_OK);
            }
LAB_0048dfba:
            pcVar6 = local_268;
            pcVar7 = local_270;
          } while ((pcVar10->more != (curl_httppost *)0x0) &&
                  (pcVar10 = pcVar10->more, CVar4 == CURLE_OK));
          pcVar3 = local_270;
          if ((CVar4 != CURLE_OK) ||
             ((post->more != (curl_httppost *)0x0 &&
              (CVar4 = AddFormDataf(&local_260,&local_278,"\r\n--%s--",local_270),
              pcVar3 = local_270, CVar4 != CURLE_OK)))) goto joined_r0x0048e089;
          post = post->next;
        } while (post != (curl_httppost *)0x0);
        CVar4 = AddFormDataf(&local_260,&local_278,"\r\n--%s--\r\n",pcVar6);
        pcVar3 = local_270;
        if (CVar4 == CURLE_OK) {
          *local_240 = local_278;
          if (pcVar7 != (char *)0x0) {
            (*Curl_cfree)(local_270);
          }
          (*Curl_cfree)(pcVar6);
          *local_258 = pFVar2;
          CVar4 = CURLE_OK;
        }
        else {
joined_r0x0048e089:
          while (local_270 = pcVar3, pFVar2 != (FormData *)0x0) {
            pFVar8 = pFVar2->next;
            if (pFVar2->type < FORM_CALLBACK) {
              (*Curl_cfree)(pFVar2->line);
            }
            (*Curl_cfree)(pFVar2);
            pcVar3 = local_270;
            pFVar2 = pFVar8;
          }
          if (local_270 != (char *)0x0) {
            (*Curl_cfree)(local_270);
          }
          (*Curl_cfree)(pcVar6);
        }
      }
      else {
        (*Curl_cfree)(pcVar6);
      }
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_getformdata(struct SessionHandle *data,
                          struct FormData **finalform,
                          struct curl_httppost *post,
                          const char *custom_content_type,
                          curl_off_t *sizep)
{
  struct FormData *form = NULL;
  struct FormData *firstform;
  struct curl_httppost *file;
  CURLcode result = CURLE_OK;

  curl_off_t size = 0; /* support potentially ENORMOUS formposts */
  char *boundary;
  char *fileboundary = NULL;
  struct curl_slist* curList;

  *finalform = NULL; /* default form is empty */

  if(!post)
    return result; /* no input => no output! */

  boundary = formboundary(data);
  if(!boundary)
    return CURLE_OUT_OF_MEMORY;

  /* Make the first line of the output */
  result = AddFormDataf(&form, NULL,
                        "%s; boundary=%s\r\n",
                        custom_content_type?custom_content_type:
                        "Content-Type: multipart/form-data",
                        boundary);

  if(result) {
    Curl_safefree(boundary);
    return result;
  }
  /* we DO NOT include that line in the total size of the POST, since it'll be
     part of the header! */

  firstform = form;

  do {

    if(size) {
      result = AddFormDataf(&form, &size, "\r\n");
      if(result)
        break;
    }

    /* boundary */
    result = AddFormDataf(&form, &size, "--%s\r\n", boundary);
    if(result)
      break;

    /* Maybe later this should be disabled when a custom_content_type is
       passed, since Content-Disposition is not meaningful for all multipart
       types.
    */
    result = AddFormDataf(&form, &size,
                          "Content-Disposition: form-data; name=\"");
    if(result)
      break;

    result = AddFormData(&form, FORM_DATA, post->name, post->namelength,
                         &size);
    if(result)
      break;

    result = AddFormDataf(&form, &size, "\"");
    if(result)
      break;

    if(post->more) {
      /* If used, this is a link to more file names, we must then do
         the magic to include several files with the same field name */

      Curl_safefree(fileboundary);
      fileboundary = formboundary(data);
      if(!fileboundary) {
        result = CURLE_OUT_OF_MEMORY;
        break;
      }

      result = AddFormDataf(&form, &size,
                            "\r\nContent-Type: multipart/mixed;"
                            " boundary=%s\r\n",
                            fileboundary);
      if(result)
        break;
    }

    file = post;

    do {

      /* If 'showfilename' is set, that is a faked name passed on to us
         to use to in the formpost. If that is not set, the actually used
         local file name should be added. */

      if(post->more) {
        /* if multiple-file */
        result = AddFormDataf(&form, &size,
                              "\r\n--%s\r\nContent-Disposition: "
                              "attachment",
                              fileboundary);
        if(result)
          break;
        result = formdata_add_filename(file, &form, &size);
        if(result)
          break;
      }
      else if(post->flags & (HTTPPOST_FILENAME|HTTPPOST_BUFFER|
                             HTTPPOST_CALLBACK)) {
        /* it should be noted that for the HTTPPOST_FILENAME and
           HTTPPOST_CALLBACK cases the ->showfilename struct member is always
           assigned at this point */
        if(post->showfilename || (post->flags & HTTPPOST_FILENAME)) {
          result = formdata_add_filename(post, &form, &size);
        }

        if(result)
          break;
      }

      if(file->contenttype) {
        /* we have a specified type */
        result = AddFormDataf(&form, &size,
                              "\r\nContent-Type: %s",
                              file->contenttype);
        if(result)
          break;
      }

      curList = file->contentheader;
      while(curList) {
        /* Process the additional headers specified for this form */
        result = AddFormDataf( &form, &size, "\r\n%s", curList->data );
        if(result)
          break;
        curList = curList->next;
      }
      if(result)
        break;

      result = AddFormDataf(&form, &size, "\r\n\r\n");
      if(result)
        break;

      if((post->flags & HTTPPOST_FILENAME) ||
         (post->flags & HTTPPOST_READFILE)) {
        /* we should include the contents from the specified file */
        FILE *fileread;

        fileread = strequal("-", file->contents)?
          stdin:fopen(file->contents, "rb"); /* binary read for win32  */

        /*
         * VMS: This only allows for stream files on VMS.  Stream files are
         * OK, as are FIXED & VAR files WITHOUT implied CC For implied CC,
         * every record needs to have a \n appended & 1 added to SIZE
         */

        if(fileread) {
          if(fileread != stdin) {
            /* close the file */
            fclose(fileread);
            /* add the file name only - for later reading from this */
            result = AddFormData(&form, FORM_FILE, file->contents, 0, &size);
          }
          else {
            /* When uploading from stdin, we can't know the size of the file,
             * thus must read the full file as before. We *could* use chunked
             * transfer-encoding, but that only works for HTTP 1.1 and we
             * can't be sure we work with such a server.
             */
            size_t nread;
            char buffer[512];
            while((nread = fread(buffer, 1, sizeof(buffer), fileread)) != 0) {
              result = AddFormData(&form, FORM_CONTENT, buffer, nread, &size);
              if(result)
                break;
            }
          }
        }
        else {
          if(data)
            failf(data, "couldn't open file \"%s\"", file->contents);
          *finalform = NULL;
          result = CURLE_READ_ERROR;
        }
      }
      else if(post->flags & HTTPPOST_BUFFER)
        /* include contents of buffer */
        result = AddFormData(&form, FORM_CONTENT, post->buffer,
                             post->bufferlength, &size);
      else if(post->flags & HTTPPOST_CALLBACK)
        /* the contents should be read with the callback and the size
           is set with the contentslength */
        result = AddFormData(&form, FORM_CALLBACK, post->userp,
                             post->contentslength, &size);
      else
        /* include the contents we got */
        result = AddFormData(&form, FORM_CONTENT, post->contents,
                             post->contentslength, &size);

      file = file->more;
    } while(file && !result); /* for each specified file for this field */

    if(result)
      break;

    if(post->more) {
      /* this was a multiple-file inclusion, make a termination file
         boundary: */
      result = AddFormDataf(&form, &size,
                           "\r\n--%s--",
                           fileboundary);
      if(result)
        break;
    }

  } while((post = post->next) != NULL); /* for each field */

  /* end-boundary for everything */
  if(CURLE_OK == result)
    result = AddFormDataf(&form, &size,
                          "\r\n--%s--\r\n",
                          boundary);

  if(result) {
    Curl_formclean(&firstform);
    Curl_safefree(fileboundary);
    Curl_safefree(boundary);
    return result;
  }

  *sizep = size;

  Curl_safefree(fileboundary);
  Curl_safefree(boundary);

  *finalform = firstform;

  return result;
}